

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carLot.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int choice;
  vector<Car,_std::allocator<Car>_> cars;
  int local_4c;
  vector<Car,_std::allocator<Car>_> local_48;
  
  local_48.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  do {
    local_4c = 0;
    poVar1 = std::operator<<((ostream *)&std::cout,"Welcome to the car inventory system!");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Please chose a number:");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"1) Add car");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"2) List inventory");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"3) Display profit");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"4) Quit");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<((ostream *)&std::cout,"Choice [1-4]: ");
    std::istream::operator>>((istream *)&std::cin,&local_4c);
    switch(local_4c) {
    case 1:
      AddCar(&local_48);
      break;
    case 2:
      PrintInventory(&local_48);
      break;
    case 3:
      CalculateProfit(&local_48);
      break;
    case 4:
      exit(0);
    }
  } while( true );
}

Assistant:

int main()
{
    vector<Car> cars;

    do
    {
        int choice = 0;

        cout << "Welcome to the car inventory system!" << endl;
        cout << "Please chose a number:" << endl << endl;
        cout << "1) Add car" << endl;
        cout << "2) List inventory" << endl;
        cout << "3) Display profit" << endl;
        cout << "4) Quit" << endl;
        cout << "Choice [1-4]: ";

        cin >> choice;

        switch(choice)
        {
            case 1:
                AddCar(cars);
                break;
            case 2:
                PrintInventory(cars);
                break;
            case 3:
                CalculateProfit(cars);
                break;
            case 4:
                exit(0);
            default:
                break;
        }

    }
    while(true);

    return 0;
}